

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
::
nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>const&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  size_t *psVar3;
  offset_in_Preprocessor_to_subr *poVar4;
  value_type_pointer ppVar5;
  uint uVar6;
  ushort uVar7;
  size_t sVar8;
  char *pcVar9;
  offset_in_Preprocessor_to_subr oVar10;
  ulong uVar11;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
  *ppVar12;
  long lVar13;
  ulong uVar14;
  group_type_pointer pgVar15;
  undefined1 auVar16 [16];
  
  pgVar15 = __return_storage_ptr__->pg;
  uVar11 = (ulong)__return_storage_ptr__->n;
  ppVar12 = __return_storage_ptr__->p;
  lVar13 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar16[0] = -(pgVar2->m[0].n == '\0');
    auVar16[1] = -(pgVar2->m[1].n == '\0');
    auVar16[2] = -(pgVar2->m[2].n == '\0');
    auVar16[3] = -(pgVar2->m[3].n == '\0');
    auVar16[4] = -(pgVar2->m[4].n == '\0');
    auVar16[5] = -(pgVar2->m[5].n == '\0');
    auVar16[6] = -(pgVar2->m[6].n == '\0');
    auVar16[7] = -(pgVar2->m[7].n == '\0');
    auVar16[8] = -(pgVar2->m[8].n == '\0');
    auVar16[9] = -(pgVar2->m[9].n == '\0');
    auVar16[10] = -(pgVar2->m[10].n == '\0');
    auVar16[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar16[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar16[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar16[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar16[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar7 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
    if (uVar7 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar6 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar11 = (ulong)uVar6;
      ppVar5 = arrays_->elements_;
      uVar14 = (ulong)(uVar6 << 5);
      ppVar12 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
                 *)((long)&ppVar5[pos0 * 0xf].first._M_len + uVar14);
      sVar8 = (args->first)._M_len;
      pcVar9 = (args->first)._M_str;
      oVar10 = *(offset_in_Preprocessor_to_subr *)&args->field_0x18;
      poVar4 = (offset_in_Preprocessor_to_subr *)((long)&ppVar5[pos0 * 0xf].second + uVar14);
      *poVar4 = args->second;
      poVar4[1] = oVar10;
      psVar3 = (size_t *)((long)&ppVar5[pos0 * 0xf].first._M_len + uVar14);
      *psVar3 = sVar8;
      psVar3[1] = (size_t)pcVar9;
      pgVar1->m[uVar11].n =
           group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::word
           [(hash & 0xff) * 4];
      pgVar15 = pgVar1;
    }
    if (uVar7 != 0) break;
    pos0 = pos0 + lVar13 & arrays_->groups_size_mask;
    lVar13 = lVar13 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar11;
  __return_storage_ptr__->p = ppVar12;
  __return_storage_ptr__->pg = pgVar15;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }